

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

bool __thiscall CDBWrapper::ExistsImpl(CDBWrapper *this,Span<const_std::byte> key)

{
  char cVar1;
  long lVar2;
  DB *pDVar3;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar4;
  bool bVar5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  Status status;
  Slice slKey;
  string local_68;
  string strValue;
  
  slKey.size_ = key.m_size;
  slKey.data_ = (char *)key.m_data;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  strValue._M_string_length = 0;
  strValue.field_2._M_local_buf[0] = '\0';
  strValue._M_dataplus._M_p = (pointer)&strValue.field_2;
  puVar4 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pDVar3 = ((puVar4->_M_t).
            super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
            super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
            super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
  puVar4 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (*pDVar3->_vptr_DB[5])
            (&status,pDVar3,
             &((puVar4->_M_t).
               super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
               super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
               super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->readoptions,&slKey,
             &strValue);
  bVar5 = true;
  if (status.state_ != (char *)0x0) {
    cVar1 = status.state_[4];
    if (cVar1 != '\x01') {
      leveldb::Status::ToString_abi_cxx11_(&local_68,&status);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
      ;
      source_file._M_len = 0x5d;
      logging_function._M_str = "ExistsImpl";
      logging_function._M_len = 10;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x169,ALL,Info,(ConstevalFormatString<1U>)0xf6e4f1,
                 &local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      HandleError(&status);
      if (status.state_ == (char *)0x0) goto LAB_00865ac2;
    }
    operator_delete__(status.state_);
    bVar5 = cVar1 != '\x01';
  }
LAB_00865ac2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strValue._M_dataplus._M_p != &strValue.field_2) {
    operator_delete(strValue._M_dataplus._M_p,
                    CONCAT71(strValue.field_2._M_allocated_capacity._1_7_,
                             strValue.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::ExistsImpl(Span<const std::byte> key) const
{
    leveldb::Slice slKey(CharCast(key.data()), key.size());

    std::string strValue;
    leveldb::Status status = DBContext().pdb->Get(DBContext().readoptions, slKey, &strValue);
    if (!status.ok()) {
        if (status.IsNotFound())
            return false;
        LogPrintf("LevelDB read failure: %s\n", status.ToString());
        HandleError(status);
    }
    return true;
}